

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

AST_Labeled_Statement * get_labeled_statement_tree(token *label,AST *statement,AST_Type type)

{
  AST_Labeled_Statement *pAVar1;
  AST_Labeled_Statement *ret;
  AST_Type type_local;
  AST *statement_local;
  token *label_local;
  
  pAVar1 = (AST_Labeled_Statement *)malloc(0x18);
  pAVar1->type = type;
  pAVar1->label = label;
  pAVar1->statement = statement;
  return pAVar1;
}

Assistant:

struct AST_Labeled_Statement* get_labeled_statement_tree(struct token *label,struct AST* statement,enum AST_Type type)
{
	struct AST_Labeled_Statement *ret;
	ret=malloc(sizeof(struct AST_Labeled_Statement));
	ret->type=type;
	ret->label=label;
	ret->statement=statement;

	return ret;
}